

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-input.c
# Opt level: O3

void message_flush(game_event_type unused,game_event_data *data,void *user)

{
  int *h_00;
  wchar_t w;
  wchar_t h;
  wchar_t local_10;
  int local_c;
  
  if (msg_flag) {
    if (message_column == L'\0') {
      return;
    }
    if (Term != (term *)0x0) {
      h_00 = &local_c;
      Term_get_size(&local_10,h_00);
      while (local_10 + L'\xfffffff8' < message_column) {
        msg_flush_split_existing(local_10,h_00);
      }
      if (message_column != L'\0') {
        msg_flush(message_column);
      }
    }
    msg_flag = false;
  }
  message_column = L'\0';
  return;
}

Assistant:

void message_flush(game_event_type unused, game_event_data *data, void *user)
{
	/* Hack -- Reset */
	if (!msg_flag) message_column = 0;

	/* Flush when needed */
	if (message_column) {
		/* Print pending messages */
		if (Term) {
			int w, h;

			(void)Term_get_size(&w, &h);
			while (message_column > w - 8) {
				msg_flush_split_existing(w, &message_column);
			}
			if (message_column) {
				msg_flush(message_column);
			}
		}

		/* Forget it */
		msg_flag = false;

		/* Reset */
		message_column = 0;
	}
}